

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O1

ssize_t read(int __fd,void *__buf,size_t __nbytes)

{
  void *__s;
  ssize_t sVar1;
  ssize_t extraout_RAX;
  uint uVar2;
  ulong uVar3;
  size_t __n;
  char buffer_header [8];
  size_t local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_58 = 0;
  read(__fd,&local_58,8);
  __n = local_58;
  __s = malloc(local_58);
  uVar3 = 0;
  memset(__s,0,__n);
  if (__n != 0) {
    do {
      sVar1 = read(__fd,(void *)((long)__s + (long)(int)uVar3),__n);
      uVar2 = (int)uVar3 + (int)sVar1;
      uVar3 = (ulong)uVar2;
      __n = __n - (long)(int)sVar1;
    } while (__n != 0);
    uVar3 = (ulong)(int)uVar2;
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,__s,(long)__s + uVar3);
  std::__cxx11::string::operator=((string *)__buf,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  free(__s);
  return extraout_RAX;
}

Assistant:

void read(int new_socket, string& msg) {
	int valread;
	char buffer_header[sizeof(size_t)] = {0}; 
	valread = read( new_socket , buffer_header, sizeof(size_t));

	size_t msg_size;
	memcpy(&msg_size, buffer_header, sizeof(size_t));

	char* buffer_msg = (char*)malloc(msg_size*sizeof(char));
	memset(buffer_msg, '\0', sizeof(char)*msg_size);
	int length = 0;
	for(length = 0; msg_size != 0; length += valread) {
		valread = read( new_socket , buffer_msg+length, msg_size);
		msg_size -= valread;
	}

	msg = std::string(buffer_msg, length);
	free(buffer_msg);
}